

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  char cVar2;
  sqlite3 *db;
  VdbeFrame *pVVar3;
  _func_int_sqlite3_vfs_ptr_int_char_ptr *p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  VdbeFrame *pFrame;
  int iVar11;
  long lVar12;
  VdbeFrame *pDel;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar3 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar3;
      pVVar3 = pFrame->pParent;
    } while (pVVar3 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  releaseMemArray(p->aMem,p->nMem);
  while (pVVar3 = p->pDelFrame, pVVar3 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar3->pParent;
    iVar11 = pVVar3->nChildMem;
    iVar10 = pVVar3->nChildCsr;
    if (0 < iVar10) {
      lVar12 = 0;
      do {
        if ((&pVVar3[1].v)[(long)iVar11 * 7 + lVar12] != (Vdbe *)0x0) {
          sqlite3VdbeFreeCursorNN(pVVar3->v,(VdbeCursor *)(&pVVar3[1].v)[(long)iVar11 * 7 + lVar12])
          ;
          iVar10 = pVVar3->nChildCsr;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar10);
      iVar11 = pVVar3->nChildMem;
    }
    releaseMemArray((Mem *)(pVVar3 + 1),iVar11);
    sqlite3VdbeDeleteAuxData(pVVar3->v->db,&pVVar3->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar3->v->db,pVVar3);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if ((p->field_0xc8 & 0x80) == 0) goto LAB_00142164;
  sqlite3VdbeEnter(p);
  uVar9 = p->rc;
  bVar7 = false;
  if (uVar9 == 0) {
LAB_00141ed9:
    bVar5 = bVar7;
    bVar6 = true;
    if (p->nFkConstraint < 1) {
      iVar11 = 0;
    }
    else {
      p->rc = 0x313;
      p->errorAction = '\x02';
      iVar11 = 0;
      sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
    }
  }
  else {
    bVar8 = (byte)uVar9;
    if ((bVar8 < 0xe) && ((0x2680U >> (uVar9 & 0x1f) & 1) != 0)) {
      bVar5 = true;
      iVar11 = 0;
      if ((bVar8 == 9 & (byte)((*(ushort *)&p->field_0xc8 & 0x40) >> 6)) == 0) {
        if (((bVar8 == 0xd) || ((uVar9 & 0xff) == 7)) && ((*(ushort *)&p->field_0xc8 & 0x20) != 0))
        {
          iVar11 = 2;
          bVar6 = false;
        }
        else {
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
          bVar5 = true;
          bVar6 = true;
          iVar11 = 0;
          bVar7 = true;
          if (p->rc == 0) goto LAB_00141ed9;
        }
      }
      else {
        bVar6 = true;
      }
    }
    else {
      bVar6 = true;
      bVar5 = false;
      iVar11 = 0;
      bVar7 = false;
      if (p->errorAction == '\x03') goto LAB_00141ed9;
    }
  }
  if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
     ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc8 & 0x40) == 0))))) {
    if ((p->rc == 0) || (!bVar5 && p->errorAction == '\x03')) {
      iVar10 = sqlite3VdbeCheckFk(p,1);
      if (iVar10 != 0) {
        uVar9 = 0x313;
        if ((p->field_0xc8 & 0x40) != 0) {
          iVar11 = 1;
LAB_00141fd4:
          if (p->lockMask == 0) {
            return iVar11;
          }
          vdbeLeave(p);
          return iVar11;
        }
LAB_00142076:
        p->rc = uVar9;
        goto LAB_0014207a;
      }
      if ((db->flags >> 0x21 & 1) != 0) {
        db->flags = db->flags & 0xfffffffdffffffff;
        uVar9 = 0xb;
        goto LAB_00142076;
      }
      uVar9 = vdbeCommit(db,p);
      if (uVar9 != 0) {
        if (uVar9 == 5) {
          uVar9 = 5;
          if ((p->field_0xc8 & 0x40) != 0) {
            iVar11 = 5;
            goto LAB_00141fd4;
          }
        }
        else if ((uVar9 & 0xfb) == 10 && uVar9 != 0xc0a) {
          p_Var4 = db->pVfs->xGetLastError;
          if (p_Var4 == (_func_int_sqlite3_vfs_ptr_int_char_ptr *)0x0) {
            iVar10 = 0;
          }
          else {
            iVar10 = (*p_Var4)(db->pVfs,0,(char *)0x0);
          }
          db->iSysErrno = iVar10;
        }
        goto LAB_00142076;
      }
      db->nDeferredCons = 0;
      db->nDeferredImmCons = 0;
      pbVar1 = (byte *)((long)&db->flags + 2);
      *pbVar1 = *pbVar1 & 0xf7;
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
    }
    else {
      if ((p->rc != 0x11) || (db->nVdbeActive < 2)) {
LAB_0014207a:
        sqlite3RollbackAll(db,0);
      }
      p->nChange = 0;
    }
    db->nStatement = 0;
    if (!bVar6) goto LAB_001420ae;
    if ((p->field_0xc8 & 0x10) != 0) {
LAB_0014213c:
      lVar12 = p->nChange;
      goto LAB_00142140;
    }
  }
  else {
    if (((bVar6) && (iVar11 = 1, p->rc != 0)) && (p->errorAction != '\x03')) {
      if (p->errorAction == '\x02') {
        iVar11 = 2;
        goto LAB_001420ae;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
      p->nChange = 0;
      if ((p->field_0xc8 & 0x10) == 0) goto LAB_00142153;
      lVar12 = 0;
LAB_00142140:
      db->nChange = lVar12;
      db->nTotalChange = db->nTotalChange + lVar12;
    }
    else {
LAB_001420ae:
      if (((p->db->nStatement != 0) && (p->iStatement != 0)) &&
         (iVar10 = vdbeCloseStatement(p,iVar11), iVar10 != 0)) {
        if (p->rc == 0 || (char)p->rc == '\x13') {
          p->rc = iVar10;
          if (p->zErrMsg != (char *)0x0) {
            sqlite3DbFreeNN(db,p->zErrMsg);
          }
          p->zErrMsg = (char *)0x0;
        }
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        p->nChange = 0;
      }
      if ((p->field_0xc8 & 0x10) == 0) goto LAB_00142153;
      if (iVar11 != 2) goto LAB_0014213c;
      db->nChange = 0;
    }
    p->nChange = 0;
  }
LAB_00142153:
  if (p->lockMask != 0) {
    vdbeLeave(p);
  }
LAB_00142164:
  db->nVdbeActive = db->nVdbeActive + -1;
  cVar2 = (char)*(ushort *)&p->field_0xc8;
  if ((*(ushort *)&p->field_0xc8 & 0x40) == 0) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
    cVar2 = (char)*(undefined2 *)&p->field_0xc8;
  }
  if (cVar2 < '\0') {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
  p->eVdbeState = '\x03';
  if (db->mallocFailed == '\0') {
    iVar11 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine.
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  assert( p->eVdbeState==VDBE_RUN_STATE );
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    if( p->rc ){
      mrc = p->rc & 0xff;
      isSpecialError = mrc==SQLITE_NOMEM
                    || mrc==SQLITE_IOERR
                    || mrc==SQLITE_INTERRUPT
                    || mrc==SQLITE_FULL;
    }else{
      mrc = isSpecialError = 0;
    }
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT,
      ** no rollback is necessary. Otherwise, at least a savepoint
      ** transaction must be rolled back to restore the database to a
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
      (void)sqlite3VdbeCheckFk(p, 0);
    }

    /* If the auto-commit flag is set and this is the only active writer
    ** VM, then we do either a commit or rollback of the current transaction.
    **
    ** Note: This block also runs if one of the special errors handled
    ** above has occurred.
    */
    if( !sqlite3VtabInSync(db)
     && db->autoCommit
     && db->nVdbeWrite==(p->readOnly==0)
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else if( db->flags & SQLITE_CorruptRdOnly ){
          rc = SQLITE_CORRUPT;
          db->flags &= ~SQLITE_CorruptRdOnly;
        }else{
          /* The auto-commit flag is true, the vdbe program was successful
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          sqlite3SystemError(db, rc);
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~(u64)SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else if( p->rc==SQLITE_SCHEMA && db->nVdbeActive>1 ){
        p->nChange = 0;
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter.
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  db->nVdbeActive--;
  if( !p->readOnly ) db->nVdbeWrite--;
  if( p->bIsReader ) db->nVdbeRead--;
  assert( db->nVdbeActive>=db->nVdbeRead );
  assert( db->nVdbeRead>=db->nVdbeWrite );
  assert( db->nVdbeWrite>=0 );
  p->eVdbeState = VDBE_HALT_STATE;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked()
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}